

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckUint(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            *this,Context *context,uint64_t i)

{
  ushort uVar1;
  bool bVar2;
  ValueType *actualType;
  Ch *pCVar3;
  uint64_t uVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  ValidateErrorCode validateErrorCode;
  undefined4 local_38;
  undefined4 uStack_34;
  
  if ((this->type_ & 0x60) == 0) {
    actualType = GetIntegerString();
    DisallowedType(this,context,actualType);
    context->invalidCode = kValidateErrorType;
    this_00 = GetTypeString();
    goto LAB_0014f1cb;
  }
  uVar1 = (this->minimum_).data_.f.flags;
  local_38 = (undefined4)i;
  uStack_34 = (undefined4)(i >> 0x20);
  if (uVar1 == 0) {
LAB_0014f133:
    uVar1 = (this->maximum_).data_.f.flags;
    if (uVar1 != 0) {
      if ((uVar1 >> 8 & 1) == 0) {
        if ((char)uVar1 < '\0') goto LAB_0014f1a0;
        bVar2 = CheckDoubleMaximum(this,context,
                                   ((double)CONCAT44(0x45300000,uStack_34) - 1.9342813113834067e+25)
                                   + ((double)CONCAT44(0x43300000,local_38) - 4503599627370496.0));
        if (!bVar2) {
          return false;
        }
      }
      else {
        bVar2 = this->exclusiveMaximum_;
        uVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetUint64
                          (&this->maximum_);
        if (bVar2 == true) {
          if (uVar4 <= i) {
LAB_0014f1a0:
            (*context->error_handler->_vptr_IValidationErrorHandler[6])
                      (context->error_handler,i,&this->maximum_,(ulong)this->exclusiveMaximum_);
            validateErrorCode = (uint)this->exclusiveMaximum_ | kValidateErrorMaximum;
            goto LAB_0014f1c3;
          }
        }
        else if (uVar4 < i) goto LAB_0014f1a0;
      }
    }
    uVar1 = (this->multipleOf_).data_.f.flags;
    if (uVar1 == 0) {
      return true;
    }
    if ((uVar1 >> 8 & 1) == 0) {
      bVar2 = CheckDoubleMultipleOf
                        (this,context,
                         ((double)CONCAT44(0x45300000,uStack_34) - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,local_38) - 4503599627370496.0));
      if (!bVar2) {
        return false;
      }
      return true;
    }
    uVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetUint64
                      (&this->multipleOf_);
    if (i % uVar4 == 0) {
      return true;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[3])
              (context->error_handler,i,&this->multipleOf_);
    context->invalidCode = kValidateErrorMultipleOf;
    this_00 = GetMultipleOfString();
  }
  else {
    if ((uVar1 >> 8 & 1) == 0) {
      if ((-1 < (char)uVar1) &&
         (bVar2 = CheckDoubleMinimum(this,context,
                                     ((double)CONCAT44(0x45300000,uStack_34) -
                                     1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,local_38) - 4503599627370496.0)),
         !bVar2)) {
        return false;
      }
      goto LAB_0014f133;
    }
    bVar2 = this->exclusiveMinimum_;
    uVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetUint64(&this->minimum_)
    ;
    if (bVar2 == true) {
      if (uVar4 < i) goto LAB_0014f133;
    }
    else if (uVar4 <= i) goto LAB_0014f133;
    (*context->error_handler->_vptr_IValidationErrorHandler[9])
              (context->error_handler,i,&this->minimum_,(ulong)this->exclusiveMinimum_);
    validateErrorCode = (uint)this->exclusiveMinimum_ | kValidateErrorMinimum;
LAB_0014f1c3:
    context->invalidCode = validateErrorCode;
    this_00 = GetValidateErrorKeyword(validateErrorCode);
  }
LAB_0014f1cb:
  pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar3;
  return false;
}

Assistant:

bool CheckUint(Context& context, uint64_t i) const {
        if (!(type_ & ((1 << kIntegerSchemaType) | (1 << kNumberSchemaType)))) {
            DisallowedType(context, GetIntegerString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }

        if (!minimum_.IsNull()) {
            if (minimum_.IsUint64()) {
                if (exclusiveMinimum_ ? i <= minimum_.GetUint64() : i < minimum_.GetUint64()) {
                    context.error_handler.BelowMinimum(i, minimum_, exclusiveMinimum_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMinimum_ ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum);
                }
            }
            else if (minimum_.IsInt64())
                /* do nothing */; // i >= 0 > minimum.Getint64()
            else if (!CheckDoubleMinimum(context, static_cast<double>(i)))
                return false;
        }

        if (!maximum_.IsNull()) {
            if (maximum_.IsUint64()) {
                if (exclusiveMaximum_ ? i >= maximum_.GetUint64() : i > maximum_.GetUint64()) {
                    context.error_handler.AboveMaximum(i, maximum_, exclusiveMaximum_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMaximum_ ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum);
                }
            }
            else if (maximum_.IsInt64()) {
                context.error_handler.AboveMaximum(i, maximum_, exclusiveMaximum_);
                RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMaximum_ ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum); // i >= 0 > maximum_
            }
            else if (!CheckDoubleMaximum(context, static_cast<double>(i)))
                return false;
        }

        if (!multipleOf_.IsNull()) {
            if (multipleOf_.IsUint64()) {
                if (i % multipleOf_.GetUint64() != 0) {
                    context.error_handler.NotMultipleOf(i, multipleOf_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMultipleOf);
                }
            }
            else if (!CheckDoubleMultipleOf(context, static_cast<double>(i)))
                return false;
        }

        return true;
    }